

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z2_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
                *matrix)

{
  _Bit_pointer *this;
  initializer_list<bool> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<bool> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<bool> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<bool> __l_07;
  initializer_list<unsigned_int> __l_08;
  reference pvVar1;
  bool local_1cf [7];
  iterator local_1c8;
  undefined8 local_1c0;
  uint local_1b8 [8];
  iterator local_198;
  undefined8 local_190;
  bool local_186 [6];
  iterator local_180;
  undefined8 local_178;
  uint local_170 [4];
  iterator local_160;
  undefined8 local_158;
  initializer_list<bool> local_150;
  initializer_list<unsigned_int> local_140;
  bool local_12f [7];
  iterator local_128;
  undefined8 local_120;
  uint local_118 [6];
  iterator local_100;
  undefined8 local_f8;
  bool local_ef [7];
  iterator local_e8;
  undefined8 local_e0;
  uint local_d8 [6];
  iterator local_c0;
  undefined8 local_b8;
  bool local_ae [6];
  iterator local_a8;
  undefined8 local_a0;
  uint local_88 [4];
  iterator local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> veccont;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setcont;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
  *matrix_local;
  
  this = &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_68);
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 3;
  local_88[3] = 5;
  local_78 = local_88;
  local_70 = 4;
  __l_08._M_len = 4;
  __l_08._M_array = local_78;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this,
             __l_08);
  local_ae[0] = true;
  local_ae[1] = true;
  local_ae[2] = false;
  local_ae[3] = true;
  local_ae[4] = false;
  local_ae[5] = true;
  local_a8 = local_ae;
  local_a0 = 6;
  __l_07._M_len = 6;
  __l_07._M_array = local_a8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_07);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_d8[0] = 0;
  local_d8[1] = 1;
  local_d8[2] = 2;
  local_d8[3] = 5;
  local_d8[4] = 6;
  local_c0 = local_d8;
  local_b8 = 5;
  __l_06._M_len = 5;
  __l_06._M_array = local_c0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_06);
  local_ef[0] = true;
  local_ef[1] = true;
  local_ef[2] = true;
  local_ef[3] = false;
  local_ef[4] = false;
  local_ef[5] = true;
  local_ef[6] = true;
  local_e8 = local_ef;
  local_e0 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_e8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_05);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_118[0] = 0;
  local_118[1] = 1;
  local_118[2] = 2;
  local_118[3] = 5;
  local_118[4] = 6;
  local_100 = local_118;
  local_f8 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_100;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_04);
  local_12f[0] = true;
  local_12f[1] = true;
  local_12f[2] = true;
  local_12f[3] = false;
  local_12f[4] = false;
  local_12f[5] = true;
  local_12f[6] = true;
  local_128 = local_12f;
  local_120 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_128;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_03);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  std::initializer_list<unsigned_int>::initializer_list(&local_140);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,local_140);
  std::initializer_list<bool>::initializer_list(&local_150);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,local_150);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_170[0] = 0;
  local_170[1] = 1;
  local_170[2] = 3;
  local_170[3] = 5;
  local_160 = local_170;
  local_158 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = local_160;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_02);
  local_186[0] = true;
  local_186[1] = true;
  local_186[2] = false;
  local_186[3] = true;
  local_186[4] = false;
  local_186[5] = true;
  local_180 = local_186;
  local_178 = 6;
  __l_01._M_len = 6;
  __l_01._M_array = local_180;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_01);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_1b8[0] = 0;
  local_1b8[1] = 1;
  local_1b8[2] = 2;
  local_1b8[3] = 5;
  local_1b8[4] = 6;
  local_198 = local_1b8;
  local_190 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_198;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_00);
  local_1cf[0] = true;
  local_1cf[1] = true;
  local_1cf[2] = true;
  local_1cf[3] = false;
  local_1cf[4] = false;
  local_1cf[5] = true;
  local_1cf[6] = true;
  local_1c8 = local_1cf;
  local_1c0 = 7;
  __l._M_len = 7;
  __l._M_array = local_1c8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,unsigned_int>
            (pvVar1,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z2_content_access(std::vector<Column>& matrix) {
  std::set<unsigned int> setcont;
  std::vector<typename Column::Field_element> veccont;

  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[1], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[2], setcont, veccont);

  setcont = {};
  veccont = {};
  column_test_common_content_access(matrix[3], setcont, veccont);

  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
}